

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.cpp
# Opt level: O1

bool chibi_filesystem::write_if_different(char *text,char *filename)

{
  int iVar1;
  FILE *__stream;
  __ssize_t _Var2;
  FILE *__stream_00;
  bool bVar3;
  char *line;
  string existing_text;
  size_t line_size;
  char *local_68;
  char *local_60;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48 [16];
  size_t local_38;
  
  local_60 = text;
  __stream = fopen(filename,"rt");
  if (__stream != (FILE *)0x0) {
    local_58 = local_48;
    local_50 = 0;
    local_48[0] = 0;
    local_68 = (char *)0x0;
    local_38 = 0;
    do {
      _Var2 = getline(&local_68,&local_38,__stream);
      if (_Var2 < 0) break;
      std::__cxx11::string::append((char *)&local_58);
    } while (-1 < _Var2);
    free(local_68);
    local_68 = (char *)0x0;
    iVar1 = std::__cxx11::string::compare((char *)&local_58);
    fclose(__stream);
    if (local_58 != local_48) {
      operator_delete(local_58);
    }
    __stream = (FILE *)0x0;
    if (iVar1 == 0) {
      bVar3 = true;
      goto LAB_00110068;
    }
  }
  __stream_00 = fopen(filename,"wt");
  bVar3 = __stream_00 != (FILE *)0x0;
  if (bVar3) {
    fputs(local_60,__stream_00);
    fclose(__stream_00);
    __stream_00 = (FILE *)0x0;
  }
  if (__stream_00 != (FILE *)0x0) {
    fclose(__stream_00);
  }
LAB_00110068:
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  return bVar3;
}

Assistant:

bool write_if_different(const char * text, const char * filename)
	{
		FileHandle existing_file(filename, "rt");
		
		bool is_equal = false;
		
		if (existing_file != nullptr)
		{
			std::string existing_text;
			
			char * line = nullptr;
			size_t line_size = 0;
			
			for (;;)
			{
				const ssize_t r = getline(&line, &line_size, existing_file);
				
				if (r < 0)
					break;
				
				existing_text.append(line);
			}
			
			free(line);
			line = nullptr;
			
			if (text == existing_text)
				is_equal = true;
			
			existing_file.close();
		}
		
		if (is_equal)
		{
			return true;
		}
		else
		{
			FileHandle file(filename, "wt");
			
			if (file == nullptr)
			{
				return false;
			}
			else
			{
				fprintf(file, "%s", text);
				
				file.close();
				
				return true;
			}
		}
	}